

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeIdentification.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::TapeIdentification::
TapeIdentification<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (TapeIdentification *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber)

{
  uint in_EAX;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  record::Base<njoy::ENDFtk::record::Character<66>>::
  Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Base<njoy::ENDFtk::record::Character<66>> *)this,it,end);
  uStack_28 = (ulong)(uint)uStack_28;
  record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>::
  TailVerification<int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
            ((TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>
              *)&this->tail,0,(int *)((long)&uStack_28 + 4),it,end,lineNumber);
  return;
}

Assistant:

TapeIdentification( Iterator& it, const Iterator& end, long& lineNumber )
      try: base( it, end ), tail( 0, 0, it, end, lineNumber ) {}
      catch ( std::exception& e ) {

        Log::info( "Encountered trouble when reading TapeIdentification" );
        throw e;
      }
      catch ( int fieldNo ) {

        --lineNumber;
        /* TODO error information here */
        throw std::exception();
      }